

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_connection.hpp
# Opt level: O0

int __thiscall
cpp_client::Connection_internal::connect
          (Connection_internal *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  char *__service;
  Communication_error *pCVar2;
  undefined4 in_register_00000034;
  addrinfo *paStack_a8;
  int res;
  addrinfo *ptr;
  Free_addr local_98;
  Free_addr dummy;
  int local_7c;
  int resaddr;
  int i;
  string port_str;
  undefined1 local_58 [8];
  addrinfo hints;
  addrinfo *result;
  int num_tries;
  uint port_local;
  char *host_local;
  Connection_internal *this_local;
  
  memset(local_58,0,0x30);
  local_58._4_4_ = 0;
  hints.ai_flags = 1;
  hints.ai_family = 0;
  std::__cxx11::to_string((__cxx11 *)&resaddr,(uint)__addr);
  for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
    __service = (char *)std::__cxx11::string::c_str();
    iVar1 = getaddrinfo((char *)CONCAT44(in_register_00000034,__fd),__service,(addrinfo *)local_58,
                        (addrinfo **)&hints.ai_next);
    local_98.info = hints.ai_next;
    if (iVar1 == 0) {
      for (paStack_a8 = hints.ai_next; paStack_a8 != (addrinfo *)0x0;
          paStack_a8 = paStack_a8->ai_next) {
        iVar1 = socket(paStack_a8->ai_family,paStack_a8->ai_socktype,paStack_a8->ai_protocol);
        this->sock_ = iVar1;
        if ((this->sock_ != -1) &&
           (iVar1 = ::connect(this->sock_,(sockaddr *)paStack_a8->ai_addr,paStack_a8->ai_addrlen),
           iVar1 == -1)) {
          close(this->sock_);
          this->sock_ = -1;
        }
      }
    }
    else {
      switch(iVar1) {
      case -10:
        pCVar2 = (Communication_error *)__cxa_allocate_exception(0x10);
        Communication_error::runtime_error(pCVar2,"Could not resolve host name - Out of memory.");
        __cxa_throw(pCVar2,&Communication_error::typeinfo,Communication_error::~Communication_error)
        ;
      default:
        pCVar2 = (Communication_error *)__cxa_allocate_exception(0x10);
        Communication_error::runtime_error(pCVar2,"Could not resolve host name - Unknown error.");
        __cxa_throw(pCVar2,&Communication_error::typeinfo,Communication_error::~Communication_error)
        ;
      case -4:
        pCVar2 = (Communication_error *)__cxa_allocate_exception(0x10);
        Communication_error::runtime_error
                  (pCVar2,"Could not resolve host name - Unrecoverable error.");
        __cxa_throw(pCVar2,&Communication_error::typeinfo,Communication_error::~Communication_error)
        ;
      case -3:
        break;
      case -2:
        pCVar2 = (Communication_error *)__cxa_allocate_exception(0x10);
        Communication_error::runtime_error(pCVar2,"Could not resolve host name - Host not found.");
        __cxa_throw(pCVar2,&Communication_error::typeinfo,Communication_error::~Communication_error)
        ;
      }
    }
    connect::Free_addr::~Free_addr(&local_98);
  }
  if (this->sock_ != -1) {
    iVar1 = std::__cxx11::string::~string((string *)&resaddr);
    return iVar1;
  }
  pCVar2 = (Communication_error *)__cxa_allocate_exception(0x10);
  Communication_error::runtime_error(pCVar2,"Could not connect to server.");
  __cxa_throw(pCVar2,&Communication_error::typeinfo,Communication_error::~Communication_error);
}

Assistant:

void connect(const char* host, unsigned port)
   {
      struct Free_addr
      {
         addrinfo* info;
         ~Free_addr()
         {
            freeaddrinfo(info);
         }
      };
      // can have temporary name resolution failure so specify a number of tries
      constexpr auto num_tries = 3;
      // set up structures needed
      addrinfo* result;
      addrinfo hints;
      memset(&hints, 0, sizeof(hints));
      hints.ai_family = AF_UNSPEC;
      hints.ai_socktype = SOCK_STREAM;
      hints.ai_protocol = IPPROTO_IP;
      const auto port_str = std::to_string(port);
      // now try to connect
      for(auto i = 0; i < num_tries; ++i)
      {
         const auto resaddr = getaddrinfo(host, port_str.c_str(), &hints, &result);
         // free the memory allocated if going out of scope
         Free_addr dummy{result};
         if(resaddr != 0)
         {
            using ce = Communication_error;
            switch(resaddr)
            {
            case EAI_AGAIN:  continue;
            case EAI_FAIL:   throw ce("Could not resolve host name - Unrecoverable error.");
            case EAI_MEMORY: throw ce("Could not resolve host name - Out of memory.");
            case EAI_NONAME: throw ce("Could not resolve host name - Host not found.");
            default:         throw ce("Could not resolve host name - Unknown error.");
            }
         }
         // now create the socket by trying to connect to all possible addresses
         for(auto ptr = result; ptr; ptr = ptr->ai_next)
         {
            sock_ = socket(ptr->ai_family, ptr->ai_socktype, ptr->ai_protocol);
            if(sock_ == -1)
            {
               continue;
            }
            const auto res = ::connect(sock_, ptr->ai_addr, static_cast<int>(ptr->ai_addrlen));
            if(res == -1)
            {
               close(sock_);
               sock_ = -1;
            }
         }
      }
      // if sock_ is invalid some sort of error occured
      if(sock_ == -1)
      {
         throw Communication_error("Could not connect to server.");
      }
   }